

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O1

bool anon_unknown.dwarf_abf4b::testVector(void)

{
  bool bVar1;
  int iVar2;
  Value *this;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  Value v;
  allocator_type local_e1;
  ValueHolder local_e0 [2];
  long local_d0 [2];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  long *local_a0 [2];
  long local_90 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  Value local_50;
  
  Json::Value::Value(&local_50,arrayValue);
  Json::Value::Value((Value *)local_e0,"Hello");
  Json::Value::append(&local_50,(Value *)local_e0);
  Json::Value::~Value((Value *)local_e0);
  Json::Value::Value((Value *)local_e0,"world!");
  Json::Value::append(&local_50,(Value *)local_e0);
  Json::Value::~Value((Value *)local_e0);
  Json::Value::Value((Value *)local_e0,"ignore");
  Json::Value::append(&local_50,(Value *)local_e0);
  Json::Value::~Value((Value *)local_e0);
  local_e0[0].string_ = (char *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"default","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_80,__l,(allocator_type *)&local_68);
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0].string_,local_d0[0] + 1);
  }
  local_e0[0].string_ = (char *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"Hello","");
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"world!","");
  plVar4 = local_90;
  local_a0[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"ignore","");
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,__l_00,&local_e1);
  lVar5 = -0x60;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  local_e0[0].string_ = (char *)&local_50;
  if ((anonymous_namespace)::StringVectorHelper_abi_cxx11_._16_8_ == 0) goto LAB_00179c34;
  iVar2 = (*(code *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_._24_8_)
                    ((anonymous_namespace)::StringVectorHelper_abi_cxx11_,&local_80,local_e0);
  if (iVar2 == 0) {
    if ((long)local_80.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_80.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      bVar1 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (local_80.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_80.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (bVar1) {
        Json::Value::Value((Value *)local_e0,2);
        this = Json::Value::operator[](&local_50,1);
        Json::Value::operator=(this,(Value *)local_e0);
        Json::Value::~Value((Value *)local_e0);
        local_e0[0].string_ = (char *)local_d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"default","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_80,
                   local_e0,local_c0);
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0].string_,local_d0[0] + 1);
        }
        local_e0[0].string_ = (char *)&local_50;
        if ((anonymous_namespace)::StringVectorHelper_abi_cxx11_._16_8_ == 0) {
LAB_00179c34:
          std::__throw_bad_function_call();
        }
        iVar2 = (*(code *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_._24_8_)
                          ((anonymous_namespace)::StringVectorHelper_abi_cxx11_,&local_80,local_e0);
        if (iVar2 == 3) {
          Json::Value::Value((Value *)local_e0,"Hello");
          Json::Value::operator=(&local_50,(Value *)local_e0);
          Json::Value::~Value((Value *)local_e0);
          local_e0[0].string_ = (char *)local_d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"default","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_80,
                     local_e0,local_c0);
          if (local_e0[0] != local_d0) {
            operator_delete(local_e0[0].string_,local_d0[0] + 1);
          }
          local_e0[0].string_ = (char *)&local_50;
          if ((anonymous_namespace)::StringVectorHelper_abi_cxx11_._16_8_ == 0) goto LAB_00179c34;
          iVar2 = (*(code *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_._24_8_)
                            ((anonymous_namespace)::StringVectorHelper_abi_cxx11_,&local_80,local_e0
                            );
          if (iVar2 == 6) {
            local_e0[0].string_ = (char *)local_d0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"default","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_aux<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_80,local_e0,local_c0);
            if (local_e0[0] != local_d0) {
              operator_delete(local_e0[0].string_,local_d0[0] + 1);
            }
            local_e0[0].int_ = 0;
            if ((anonymous_namespace)::StringVectorHelper_abi_cxx11_._16_8_ == 0) goto LAB_00179c34;
            iVar2 = (*(code *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_._24_8_)
                              ((anonymous_namespace)::StringVectorHelper_abi_cxx11_,&local_80,
                               local_e0);
            if (iVar2 == 0) {
              if (local_80.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_80.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                bVar1 = true;
                goto LAB_00179b87;
              }
              iVar2 = 0x14e;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ASSERT_TRUE(l.empty()) failed on line ",0x26);
            }
            else {
              iVar2 = 0x14d;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(StringVectorHelper(l, nullptr) == ErrorCode::Success) failed on line "
                         ,0x51);
            }
          }
          else {
            iVar2 = 0x14a;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::InvalidArray) failed on line "
                       ,0x51);
          }
        }
        else {
          iVar2 = 0x146;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::InvalidString) failed on line "
                     ,0x52);
        }
        goto LAB_00179b63;
      }
    }
    iVar2 = 0x142;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(l == expected) failed on line ",0x2a);
  }
  else {
    iVar2 = 0x141;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::Success) failed on line ",0x4c);
  }
LAB_00179b63:
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  bVar1 = false;
LAB_00179b87:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  Json::Value::~Value(&local_50);
  return bVar1;
}

Assistant:

bool testVector()
{
  Json::Value v(Json::arrayValue);
  v.append("Hello");
  v.append("world!");
  v.append("ignore");

  std::vector<std::string> l{ "default" };
  std::vector<std::string> expected{ "Hello", "world!", "ignore" };
  ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::Success);
  ASSERT_TRUE(l == expected);

  v[1] = 2;
  l = { "default" };
  ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::InvalidString);

  v = "Hello";
  l = { "default" };
  ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::InvalidArray);

  l = { "default" };
  ASSERT_TRUE(StringVectorHelper(l, nullptr) == ErrorCode::Success);
  ASSERT_TRUE(l.empty());

  return true;
}